

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::getp_copy_from(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  int iVar2;
  vm_obj_id_t self_00;
  int iVar3;
  int idx;
  size_t sVar4;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  CVmNativeCodeDesc *in_RDI;
  size_t unaff_retaddr;
  vm_val_t val;
  int i;
  int copy_cnt;
  int dst_start;
  int dst_cnt;
  int src_start;
  int src_cnt;
  vm_val_t src_val;
  uint *in_stack_ffffffffffffff90;
  vm_val_t *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar5;
  undefined4 in_stack_ffffffffffffffa4;
  vm_val_t local_48 [2];
  vm_val_t *local_20;
  vm_obj_id_t local_14;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  if ((getp_copy_from(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_copy_from(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_copy_from::desc,4);
    __cxa_guard_release(&getp_copy_from(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_RDI)
  ;
  if (iVar1 == 0) {
    CVmStack::pop(local_48);
    iVar1 = vm_val_t::is_listlike
                      ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if ((iVar1 == 0) || (iVar1 = vm_val_t::ll_length(in_stack_ffffffffffffff98), iVar1 < 0)) {
      err_throw(0);
    }
    iVar2 = CVmBif::pop_int_val();
    if (iVar2 < 0) {
      iVar2 = iVar1 + 1 + iVar2;
    }
    sVar4 = get_element_count((CVmObjVector *)0x34b1ee);
    self_00 = (vm_obj_id_t)sVar4;
    iVar3 = CVmBif::pop_int_val();
    if (iVar3 < 0) {
      iVar3 = self_00 + 1 + iVar3;
    }
    idx = CVmBif::pop_int_val();
    if (iVar2 < 1) {
      iVar2 = 1;
    }
    if (iVar3 < 1) {
      iVar3 = 1;
    }
    iVar2 = iVar2 + -1;
    iVar3 = iVar3 + -1;
    if (iVar2 < iVar1) {
      if (iVar1 <= iVar2 + idx) {
        idx = iVar1 - iVar2;
      }
    }
    else {
      idx = 0;
    }
    if ((int)self_00 < iVar3 + idx) {
      set_element_count_undo((CVmObjVector *)val.val.native_desc,val._4_4_,unaff_retaddr);
    }
    for (iVar5 = 0; iVar5 < idx; iVar5 = iVar5 + 1) {
      vm_val_t::ll_index((vm_val_t *)CONCAT44(iVar1,iVar2),(vm_val_t *)CONCAT44(self_00,iVar3),idx);
      set_element_undo((CVmObjVector *)CONCAT44(iVar1,iVar2),self_00,CONCAT44(idx,iVar5),
                       in_stack_ffffffffffffff98);
    }
    vm_val_t::set_obj(local_20,local_14);
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_copy_from(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                 uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(4);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* retrieve the source value */
    vm_val_t src_val;
    G_stk->pop(&src_val);

    /* make sure the source argument is list-like, and get its length */
    int src_cnt;
    if (!src_val.is_listlike(vmg0_)
        || (src_cnt = src_val.ll_length(vmg0_)) < 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* get the source starting index, adjusting negatives to count from end */
    int src_start = CVmBif::pop_int_val(vmg0_);
    if (src_start < 0)
        src_start += src_cnt + 1;

    /* note the destination length (i.e., my element count) */
    int dst_cnt = get_element_count();

    /* get the destination starting index, adjusting negative values */
    int dst_start = CVmBif::pop_int_val(vmg0_);
    if (dst_start < 0)
        dst_start += dst_cnt + 1;

    /* get the number of elements to copy */
    int copy_cnt = CVmBif::pop_int_val(vmg0_);

    /* if either starting index is below 1, force it to 1 */
    if (src_start < 1)
        src_start = 1;
    if (dst_start < 1)
        dst_start = 1;

    /* adjust the starting indices to 0-based values */
    --src_start;
    --dst_start;

    /* limit our copying to the remaining elements of the source */
    if (src_start >= src_cnt)
        copy_cnt = 0;
    else if (src_start + copy_cnt >= src_cnt)
        copy_cnt = src_cnt - src_start;

    /* expand the vector if necessary to make room for added elements */
    if (dst_start + copy_cnt > dst_cnt)
        set_element_count_undo(vmg_ self, dst_start + copy_cnt);

    /* set the list elements */
    for (int i = 0 ; i < copy_cnt ; ++i)
    {
        /* get the source element at this index */
        vm_val_t val;
        src_val.ll_index(vmg_ &val, i + src_start + 1);

        /* set my element at this index, recording undo for the change */
        set_element_undo(vmg_ self, i + dst_start, &val);
    }

    /* the return value is 'self' */
    retval->set_obj(self);

    /* handled */
    return TRUE;
}